

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::CleanXFB(AttributeFormatTest *this)

{
  int iVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  AttributeFormatTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  if (this->m_bo_xfb != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_bo_xfb);
    this->m_bo_xfb = 0;
  }
  do {
    iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar2 != 0);
  return;
}

Assistant:

void AttributeFormatTest::CleanXFB()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_bo_xfb)
	{
		gl.deleteBuffers(1, &m_bo_xfb);

		m_bo_xfb = 0;
	}

	while (gl.getError())
		;
}